

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  ushort *puVar1;
  ushort uVar2;
  st_ptls_on_extension_t *psVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ushort *puVar10;
  long lVar11;
  ushort *puVar12;
  ushort *puVar13;
  ushort uVar14;
  ushort *puVar15;
  ptls_iovec_t pVar16;
  byte local_48 [12];
  uint local_3c;
  ushort *local_38;
  
  if ((long)end - (long)src < 4) {
    return 0x32;
  }
  uVar6 = *(uint *)src;
  *lifetime = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  if ((long)end - (long)(src + 4) < 4) {
    return 0x32;
  }
  uVar6 = *(uint *)(src + 4);
  *age_add = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  puVar13 = (ushort *)(src + 8);
  uVar6 = 0x32;
  if (puVar13 == (ushort *)end) {
    bVar4 = false;
  }
  else {
    uVar9 = (ulong)(byte)*puVar13;
    puVar13 = (ushort *)(src + 9);
    bVar4 = false;
    if (uVar9 <= (ulong)((long)end - (long)puVar13)) {
      nonce->base = (uint8_t *)puVar13;
      puVar13 = (ushort *)((long)puVar13 + uVar9);
      nonce->len = uVar9;
      bVar4 = true;
      uVar6 = 0;
    }
  }
  if (!bVar4) {
    return uVar6;
  }
  uVar8 = 0x32;
  if (1 < (ulong)((long)end - (long)puVar13)) {
    lVar11 = 0;
    uVar9 = 0;
    do {
      uVar9 = (ulong)*(byte *)((long)puVar13 + lVar11) | uVar9 << 8;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 2);
    puVar13 = puVar13 + 1;
    if (uVar9 - 1 < (ulong)((long)end - (long)puVar13)) {
      ticket->base = (uint8_t *)puVar13;
      puVar13 = (ushort *)((long)puVar13 + uVar9);
      ticket->len = uVar9;
      bVar4 = true;
      uVar8 = uVar6;
      goto LAB_00111d63;
    }
  }
  bVar4 = false;
LAB_00111d63:
  if (bVar4) {
    *max_early_data_size = 0;
    local_48[0] = 0x21;
    local_48[1] = 0x24;
    local_48[2] = 0x11;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0x3a;
    local_48[6] = 8;
    local_48[7] = 0;
    uVar6 = 0x32;
    if ((ulong)((long)end - (long)puVar13) < 2) {
      bVar4 = false;
      puVar10 = puVar13;
    }
    else {
      lVar11 = 0;
      uVar9 = 0;
      do {
        uVar9 = (ulong)*(byte *)((long)puVar13 + lVar11) | uVar9 << 8;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 2);
      puVar10 = puVar13 + 1;
      uVar6 = 0x32;
      if ((ulong)((long)end - (long)puVar10) < uVar9) {
LAB_00111dd6:
        bVar4 = false;
      }
      else {
        uVar6 = uVar8;
        if (uVar9 != 0) {
          puVar13 = (ushort *)((long)puVar13 + uVar9 + 2);
          local_38 = puVar13;
          puVar15 = puVar10;
          do {
            if ((long)puVar13 - (long)puVar15 < 2) {
              uVar6 = 0x32;
              puVar10 = puVar15;
              goto LAB_00111dd6;
            }
            uVar2 = *puVar15;
            uVar14 = uVar2 << 8 | uVar2 >> 8;
            puVar10 = puVar15 + 1;
            if (uVar14 < 0x40) {
              if ((local_48[uVar14 >> 3] >> (uVar14 & 7) & 1) != 0) {
                uVar6 = 0x2f;
                goto LAB_00111dd6;
              }
              if (uVar14 < 0x40) {
                local_48[uVar14 >> 3] =
                     local_48[uVar14 >> 3] | (byte)(1 << ((byte)(uVar2 >> 8) & 7));
              }
            }
            uVar6 = 0x32;
            if ((ulong)((long)puVar13 - (long)puVar10) < 2) {
              uVar8 = 0;
            }
            else {
              lVar11 = 0;
              uVar9 = 0;
              do {
                uVar9 = (ulong)*(byte *)((long)puVar10 + lVar11) | uVar9 << 8;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 2);
              puVar10 = puVar15 + 2;
              uVar8 = 0;
              if (uVar9 <= (ulong)((long)puVar13 - (long)puVar10)) {
                psVar3 = tls->ctx->on_extension;
                local_3c = (uint)uVar14;
                uVar6 = uVar8;
                if (psVar3 != (st_ptls_on_extension_t *)0x0) {
                  pVar16.len = uVar9;
                  pVar16.base = (uint8_t *)puVar10;
                  local_3c = (uint)uVar14;
                  iVar7 = (*psVar3->cb)(psVar3,tls,'\x04',uVar14,pVar16);
                  uVar6 = (uint)(iVar7 != 0);
                  puVar13 = local_38;
                  if (iVar7 != 0) {
                    uVar8 = 0;
                    goto LAB_00111f42;
                  }
                }
                puVar1 = (ushort *)(uVar9 + (long)puVar10);
                puVar12 = puVar1;
                uVar5 = uVar6;
                if ((short)local_3c == 0x2a) {
                  uVar6 = 0x32;
                  if (3 < (long)uVar9) {
                    uVar6 = *(uint *)(puVar15 + 2);
                    *max_early_data_size =
                         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                         uVar6 << 0x18;
                    puVar10 = puVar15 + 4;
                    uVar6 = 0;
                  }
                  uVar8 = 0;
                  puVar12 = puVar10;
                  uVar5 = 0;
                  if ((long)uVar9 < 4) goto LAB_00111f42;
                }
                uVar6 = uVar5;
                uVar8 = (uint)(puVar12 == puVar1);
                puVar10 = puVar12;
                if (puVar12 != puVar1) {
                  uVar6 = 0x32;
                }
              }
            }
LAB_00111f42:
            if ((char)uVar8 == '\0') goto LAB_00111dd6;
            puVar15 = puVar10;
          } while (puVar10 != puVar13);
        }
        bVar4 = true;
      }
    }
    uVar8 = uVar6;
    if (bVar4) {
      uVar8 = 0x32;
      if (puVar10 == (ushort *)end) {
        uVar8 = 0;
      }
    }
  }
  return uVar8;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}